

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpTestLog.c
# Opt level: O0

deBool qpTestLog_endEglConfigSet(qpTestLog *log)

{
  deBool dVar1;
  qpTestLog *log_local;
  
  deMutex_lock(log->lock);
  dVar1 = qpXmlWriter_endElement(log->writer,"EglConfigSet");
  if (dVar1 != 0) {
    deMutex_unlock(log->lock);
  }
  else {
    qpPrintf("qpTestLog_endEglImageSet(): Writing XML failed\n");
    deMutex_unlock(log->lock);
  }
  log_local._4_4_ = (uint)(dVar1 != 0);
  return log_local._4_4_;
}

Assistant:

deBool qpTestLog_endEglConfigSet (qpTestLog* log)
{
	DE_ASSERT(log);
	deMutex_lock(log->lock);

	/* <EglConfigSet Name="<name>"> */
	if (!qpXmlWriter_endElement(log->writer, "EglConfigSet"))
	{
		qpPrintf("qpTestLog_endEglImageSet(): Writing XML failed\n");
		deMutex_unlock(log->lock);
		return DE_FALSE;
	}

	DE_ASSERT(ContainerStack_pop(&log->containerStack) == CONTAINERTYPE_EGLCONFIGSET);

	deMutex_unlock(log->lock);
	return DE_TRUE;
}